

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncryptedPDF.cpp
# Opt level: O3

int EncryptedPDF(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  EStatusCode EVar3;
  EncryptionOptions *pEVar4;
  PDFDocumentCopyingContext *this;
  PDFParser *this_00;
  unsigned_long uVar5;
  ostream *poVar6;
  long lVar7;
  uint uVar8;
  char *pcVar9;
  unsigned_long inPageIndex;
  EStatusCodeAndObjectIDType EVar10;
  InputFile pdfFile;
  PDFParser parser;
  PDFWriter pdfWriter;
  string local_16e0;
  string local_16c0;
  undefined1 local_16a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1688;
  string local_1670;
  string local_1650;
  string local_1630;
  _Alloc_hider local_1610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1600;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_15f0;
  _Alloc_hider local_15d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_15c8;
  undefined1 local_15b0 [8];
  _Alloc_hider local_15a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1598;
  longlong local_1588;
  _Alloc_hider local_1580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1570;
  InputFile local_1560;
  PDFParser local_1530;
  PDFWriter local_ee0;
  
  InputFile::InputFile(&local_1560);
  PDFWriter::PDFWriter(&local_ee0);
  PDFParser::PDFParser(&local_1530);
  local_16e0._M_dataplus._M_p = (pointer)&local_16e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_16e0,"PDFWithPasswordDecrypted.pdf","");
  BuildRelativeOutputPath(&local_16c0,(char **)argv[2],&local_16e0);
  local_1650._M_dataplus._M_p = (pointer)&local_1650.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1650,"PDFWithPasswordDecrypted.txt","");
  BuildRelativeOutputPath(&local_1630,(char **)argv[2],&local_1650);
  LogConfiguration::LogConfiguration((LogConfiguration *)local_16a0,true,true,&local_1630);
  pEVar4 = EncryptionOptions::DefaultEncryptionOptions();
  local_15b0[0] = pEVar4->ShouldEncrypt;
  pcVar2 = (pEVar4->UserPassword)._M_dataplus._M_p;
  local_15a8._M_p = (pointer)&local_1598;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_15a8,pcVar2,pcVar2 + (pEVar4->UserPassword)._M_string_length);
  local_1588 = pEVar4->UserProtectionOptionsFlag;
  pcVar2 = (pEVar4->OwnerPassword)._M_dataplus._M_p;
  local_1580._M_p = (pointer)&local_1570;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1580,pcVar2,pcVar2 + (pEVar4->OwnerPassword)._M_string_length);
  PDFCreationSettings::PDFCreationSettings
            ((PDFCreationSettings *)&local_1610,true,true,(EncryptionOptions *)local_15b0,false);
  EVar3 = PDFWriter::StartPDF(&local_ee0,&local_16c0,ePDFVersion13,(LogConfiguration *)local_16a0,
                              (PDFCreationSettings *)&local_1610);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15d8._M_p != &local_15c8) {
    operator_delete(local_15d8._M_p,local_15c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1600._M_allocated_capacity != &local_15f0) {
    operator_delete((void *)local_1600._M_allocated_capacity,local_15f0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1580._M_p != &local_1570) {
    operator_delete(local_1580._M_p,local_1570._M_allocated_capacity + 1);
  }
  paVar1 = &local_16e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15a8._M_p != &local_1598) {
    operator_delete(local_15a8._M_p,local_1598._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16a0._8_8_ != &local_1688) {
    operator_delete((void *)local_16a0._8_8_,local_1688._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1630._M_dataplus._M_p != &local_1630.field_2) {
    operator_delete(local_1630._M_dataplus._M_p,local_1630.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1650._M_dataplus._M_p != &local_1650.field_2) {
    operator_delete(local_1650._M_dataplus._M_p,local_1650.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16c0._M_dataplus._M_p != &local_16c0.field_2) {
    operator_delete(local_16c0._M_dataplus._M_p,local_16c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_16e0._M_dataplus._M_p,local_16e0.field_2._M_allocated_capacity + 1);
  }
  if (EVar3 == eSuccess) {
    local_16e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_16e0,"PDFWithPassword.pdf","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_16a0,argv[1],(allocator<char> *)&local_1630);
    LocalPathToFileURL((FileURL *)&local_1610,(string *)local_16a0);
    RelativeURLToLocalPath(&local_16c0,(FileURL *)&local_1610,&local_16e0);
    FileURL::~FileURL((FileURL *)&local_1610);
    if ((undefined1 *)local_16a0._0_8_ != local_16a0 + 0x10) {
      operator_delete((void *)local_16a0._0_8_,local_16a0._16_8_ + 1);
    }
    local_1670._M_dataplus._M_p = (pointer)&local_1670.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1670,"user","");
    PDFParsingOptions::PDFParsingOptions((PDFParsingOptions *)&local_1610,&local_1670);
    this = PDFWriter::CreatePDFCopyingContext
                     (&local_ee0,&local_16c0,(PDFParsingOptions *)&local_1610);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1610._M_p != &local_1600) {
      operator_delete(local_1610._M_p,(ulong)(local_1600._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1670._M_dataplus._M_p != &local_1670.field_2) {
      operator_delete(local_1670._M_dataplus._M_p,local_1670.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_16c0._M_dataplus._M_p != &local_16c0.field_2) {
      operator_delete(local_16c0._M_dataplus._M_p,local_16c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_16e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_16e0._M_dataplus._M_p,local_16e0.field_2._M_allocated_capacity + 1);
    }
    if (this != (PDFDocumentCopyingContext *)0x0) {
      this_00 = PDFDocumentCopyingContext::GetSourceDocumentParser(this);
      uVar5 = PDFParser::GetPagesCount(this_00);
      if (uVar5 != 0) {
        inPageIndex = 0;
        do {
          EVar10 = PDFDocumentCopyingContext::AppendPDFPageFromPDF(this,inPageIndex);
          if (EVar10.first != eSuccess) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"failed to append page ",0x16);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," from PDFWithPassword.pdf\n",0x1a);
            break;
          }
          inPageIndex = inPageIndex + 1;
        } while (uVar5 != inPageIndex);
      }
      PDFDocumentCopyingContext::~PDFDocumentCopyingContext(this);
      operator_delete(this,0xd0);
      EVar3 = PDFWriter::EndPDF(&local_ee0);
      if (EVar3 != eSuccess) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"failed in end PDF\n",0x12);
      }
      uVar8 = (uint)(EVar3 != eSuccess);
      goto LAB_00135815;
    }
    lVar7 = 0x3e;
    pcVar9 = "failed to initialize copying context from PDFWithPassword.pdf\n";
  }
  else {
    lVar7 = 0x14;
    pcVar9 = "failed to start PDF\n";
  }
  uVar8 = 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar7);
LAB_00135815:
  PDFParser::~PDFParser(&local_1530);
  PDFWriter::~PDFWriter(&local_ee0);
  InputFile::~InputFile(&local_1560);
  return uVar8;
}

Assistant:

int EncryptedPDF(int argc, char* argv[])
{
	EStatusCode status = PDFHummus::eSuccess;
	InputFile pdfFile;
	PDFWriter pdfWriter;
	PDFDocumentCopyingContext* copyingContext = NULL;


	PDFParser parser;

	do
	{
		status = pdfWriter.StartPDF(
			BuildRelativeOutputPath(argv, "PDFWithPasswordDecrypted.pdf"), ePDFVersion13,
			LogConfiguration(true, true,
				BuildRelativeOutputPath(argv, "PDFWithPasswordDecrypted.txt")));
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to start PDF\n";
			break;
		}

		copyingContext = pdfWriter.CreatePDFCopyingContext(
			BuildRelativeInputPath(argv,"PDFWithPassword.pdf"),
			PDFParsingOptions("user"));
		if (!copyingContext)
		{
			cout << "failed to initialize copying context from PDFWithPassword.pdf\n";
			status = PDFHummus::eFailure;
			break;
		}

		unsigned long pagesCount = copyingContext->GetSourceDocumentParser()->GetPagesCount();
		for (unsigned long i = 0; i < pagesCount && status == PDFHummus::eSuccess; ++i) {
			EStatusCodeAndObjectIDType result = copyingContext->AppendPDFPageFromPDF(i);
			if (result.first != PDFHummus::eSuccess)
			{
				cout << "failed to append page "<<(i+1)<<" from PDFWithPassword.pdf\n";
				status = result.first;
				break;
			}

		}

		delete copyingContext;
		copyingContext = NULL;

		status = pdfWriter.EndPDF();
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed in end PDF\n";
			break;
		}

	} while (false);

	delete copyingContext;
	return status == eSuccess ? 0:1;
}